

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O3

void Rwt_Trav_rec(Rwt_Man_t *p,Rwt_Node_t *pNode,int *pVolume)

{
  int iVar1;
  int *piVar2;
  
  if ((pNode->field_0xb & 0x40) == 0) {
    piVar2 = (int *)&pNode->field_0x8;
    do {
      if (pNode->TravId == p->nTravIds) {
        return;
      }
      pNode->TravId = p->nTravIds;
      iVar1 = *pVolume;
      *pVolume = iVar1 + 1;
      if (*piVar2 < 0) {
        *pVolume = iVar1 + 2;
      }
      Rwt_Trav_rec(p,(Rwt_Node_t *)((ulong)pNode->p0 & 0xfffffffffffffffe),pVolume);
      pNode = (Rwt_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe);
      piVar2 = (int *)&pNode->field_0x8;
    } while ((pNode->field_0xb & 0x40) == 0);
  }
  return;
}

Assistant:

void Rwt_Trav_rec( Rwt_Man_t * p, Rwt_Node_t * pNode, int * pVolume )
{
    if ( pNode->fUsed || pNode->TravId == p->nTravIds )
        return;
    pNode->TravId = p->nTravIds;
    (*pVolume)++;
    if ( pNode->fExor )
        (*pVolume)++;
    Rwt_Trav_rec( p, Rwt_Regular(pNode->p0), pVolume );
    Rwt_Trav_rec( p, Rwt_Regular(pNode->p1), pVolume );
}